

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  Select *pSVar1;
  Expr *pLeft;
  char cVar2;
  u8 uVar3;
  undefined1 uVar4;
  u32 uVar5;
  Expr *pEVar6;
  long lVar7;
  int iVar8;
  Expr *pEVar9;
  Walker *pWVar10;
  Expr *pEVar11;
  byte bVar12;
  Expr t;
  Walker local_70;
  
  bVar12 = 0;
  iVar8 = 0;
  if (pExpr->op != ',') {
    local_70.pParse = pWalker->pParse;
    pSVar1 = (pWalker->u).pSelect;
    local_70.u = (anon_union_8_17_dfc45e9e_for_u)pSVar1->pGroupBy;
    local_70.eCode = 1;
    local_70.xExprCallback = exprNodeIsConstantOrGroupBy;
    local_70.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    walkExpr(&local_70,pExpr);
    iVar8 = 1;
    if (((local_70.eCode != 0) && ((pExpr->flags & 0x20000001) != 0x20000000)) &&
       (pExpr->pAggInfo == (AggInfo *)0x0)) {
      local_70.pParse = (Parse *)0x1f022b;
      local_70.xExprCallback =
           (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(local_70.xExprCallback._4_4_,1);
      pEVar6 = sqlite3ExprAlloc(pWalker->pParse->db,0x9b,(Token *)&local_70,0);
      if (pEVar6 != (Expr *)0x0) {
        pLeft = pSVar1->pWhere;
        pEVar9 = pEVar6;
        pWVar10 = &local_70;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          pWVar10->pParse = *(Parse **)pEVar9;
          pEVar9 = (Expr *)((long)pEVar9 + (ulong)bVar12 * -0x10 + 8);
          pWVar10 = (Walker *)((long)pWVar10 + ((ulong)bVar12 * -2 + 1) * 8);
        }
        pEVar9 = pExpr;
        pEVar11 = pEVar6;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          cVar2 = pEVar9->affExpr;
          uVar3 = pEVar9->op2;
          uVar4 = pEVar9->field_0x3;
          uVar5 = pEVar9->flags;
          pEVar11->op = pEVar9->op;
          pEVar11->affExpr = cVar2;
          pEVar11->op2 = uVar3;
          pEVar11->field_0x3 = uVar4;
          pEVar11->flags = uVar5;
          pEVar9 = (Expr *)((long)pEVar9 + (ulong)bVar12 * -0x10 + 8);
          pEVar11 = (Expr *)((long)pEVar11 + (ulong)bVar12 * -0x10 + 8);
        }
        pWVar10 = &local_70;
        for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(Parse **)pExpr = pWVar10->pParse;
          pWVar10 = (Walker *)((long)pWVar10 + ((ulong)bVar12 * -2 + 1) * 8);
          pExpr = (Expr *)((long)pExpr + (ulong)bVar12 * -0x10 + 8);
        }
        pEVar6 = sqlite3ExprAnd(pWalker->pParse,pLeft,pEVar6);
        pSVar1->pWhere = pEVar6;
        pWalker->eCode = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    /* This routine is called before the HAVING clause of the current
    ** SELECT is analyzed for aggregates. So if pExpr->pAggInfo is set
    ** here, it indicates that the expression is a correlated reference to a
    ** column from an outer aggregate query, or an aggregate function that
    ** belongs to an outer query. Do not move the expression to the WHERE
    ** clause in this obscure case, as doing so may corrupt the outer Select
    ** statements AggInfo structure.  */
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy)
     && ExprAlwaysFalse(pExpr)==0
     && pExpr->pAggInfo==0
    ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3Expr(db, TK_INTEGER, "1");
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(pWalker->pParse, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}